

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdDecomposeSingleVarOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  word *pwVar10;
  ulong uVar11;
  word *pwVar12;
  word *pwVar13;
  
  bVar2 = (byte)v;
  uVar5 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar5 = 1;
  }
  uVar9 = (ulong)uVar5;
  if ((*pTruth & 1) != 0) {
    if (v < 6) {
      if (0 < (int)uVar5) {
        uVar6 = 0;
        do {
          if ((s_Truths6Neg[v] & ~pTruth[uVar6]) != 0) goto LAB_0049fe23;
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
    }
    else if (0 < (int)uVar5) {
      bVar3 = (byte)(v + -6);
      uVar7 = 1 << (bVar3 & 0x1f);
      uVar6 = (ulong)uVar7;
      pwVar12 = pTruth;
      if ((int)uVar7 < 2) {
        uVar6 = 1;
      }
      do {
        if (v + -6 != 0x1f) {
          uVar11 = 0;
          do {
            if (pwVar12[uVar11] != 0xffffffffffffffff) goto LAB_0049fe23;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        pwVar12 = pwVar12 + (2 << (bVar3 & 0x1f));
      } while (pwVar12 < pTruth + (int)uVar5);
    }
    cVar1 = '!';
    lVar4 = 0;
    do {
      iVar8 = p->nPos;
      p->nPos = iVar8 + 1;
      p->pOutput[iVar8] = cVar1;
      cVar1 = "!("[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    if (uVar5 == 1) {
      *pTruth = (s_Truths6[v] & *pTruth) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                s_Truths6[v] & *pTruth;
    }
    else {
      if (v < 6) {
        if ((int)uVar5 < 1) goto LAB_004a0508;
        uVar6 = 0;
        do {
          pTruth[uVar6] =
               (s_Truths6[v] & pTruth[uVar6]) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
               s_Truths6[v] & pTruth[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
      else {
        if ((int)uVar5 < 1) goto LAB_004a0508;
        bVar2 = (byte)(v + -6);
        uVar7 = 1 << (bVar2 & 0x1f);
        uVar6 = 1;
        if (1 < (int)uVar7) {
          uVar6 = (ulong)uVar7;
        }
        pwVar12 = pTruth;
        do {
          if (v + -6 != 0x1f) {
            uVar11 = 0;
            do {
              pwVar12[uVar11] = pwVar12[(long)(int)uVar7 + uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar6 != uVar11);
          }
          pwVar12 = pwVar12 + (2 << (bVar2 & 0x1f));
        } while (pwVar12 < pTruth + (int)uVar5);
      }
      if ((int)uVar5 < 1) goto LAB_004a0508;
    }
    uVar6 = 0;
    do {
      pTruth[uVar6] = ~pTruth[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
    goto LAB_004a0508;
  }
  if (v < 6) {
    if ((int)uVar5 < 1) goto LAB_0049fe6f;
    uVar6 = 0;
    do {
      if ((pTruth[uVar6] & s_Truths6Neg[v]) != 0) goto LAB_0049fe23;
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
LAB_0049fc8a:
    iVar8 = p->nPos;
    p->nPos = iVar8 + 1;
    p->pOutput[iVar8] = '(';
    if (uVar5 == 1) {
      uVar9 = s_Truths6[v] & *pTruth;
      uVar6 = uVar9 >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f);
      goto LAB_0049ffc5;
    }
  }
  else {
    if (0 < (int)uVar5) {
      bVar3 = (byte)(v + -6);
      uVar7 = 1 << (bVar3 & 0x1f);
      uVar6 = (ulong)uVar7;
      pwVar12 = pTruth;
      if ((int)uVar7 < 2) {
        uVar6 = 1;
      }
      do {
        if (v + -6 != 0x1f) {
          uVar11 = 0;
          do {
            if (pwVar12[uVar11] != 0) goto LAB_0049fe23;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        pwVar12 = pwVar12 + (2 << (bVar3 & 0x1f));
      } while (pwVar12 < pTruth + (int)uVar5);
      goto LAB_0049fc8a;
    }
LAB_0049fe6f:
    iVar8 = p->nPos;
    p->nPos = iVar8 + 1;
    p->pOutput[iVar8] = '(';
  }
  if (v < 6) {
    if (0 < (int)uVar5) {
      uVar6 = 0;
      do {
        pTruth[uVar6] =
             (s_Truths6[v] & pTruth[uVar6]) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
             s_Truths6[v] & pTruth[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
  }
  else if (0 < (int)uVar5) {
    bVar2 = (byte)(v + -6);
    uVar7 = 1 << (bVar2 & 0x1f);
    uVar9 = 1;
    if (1 < (int)uVar7) {
      uVar9 = (ulong)uVar7;
    }
    pwVar12 = pTruth;
    do {
      if (v + -6 != 0x1f) {
        uVar6 = 0;
        do {
          pwVar12[uVar6] = pwVar12[(long)(int)uVar7 + uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
      pwVar12 = pwVar12 + (2 << (bVar2 & 0x1f));
    } while (pwVar12 < pTruth + (int)uVar5);
  }
  goto LAB_004a0508;
LAB_0049fe23:
  pwVar12 = pTruth + (int)uVar5;
  if ((long)pwVar12[-1] < 0) {
    if (v < 6) {
      if (0 < (int)uVar5) {
        uVar6 = 0;
        do {
          if ((s_Truths6[v] & ~pTruth[uVar6]) != 0) goto LAB_004a0145;
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
    }
    else if (0 < (int)uVar5) {
      bVar3 = (byte)(v + -6);
      uVar7 = 1 << (bVar3 & 0x1f);
      iVar8 = 2 << (bVar3 & 0x1f);
      uVar6 = 1;
      if (1 < (int)uVar7) {
        uVar6 = (ulong)uVar7;
      }
      pwVar10 = pTruth + (int)uVar7;
      pwVar13 = pTruth;
      do {
        if (v + -6 != 0x1f) {
          uVar11 = 0;
          do {
            if (pwVar10[uVar11] != 0xffffffffffffffff) goto LAB_004a0145;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        pwVar13 = pwVar13 + iVar8;
        pwVar10 = pwVar10 + iVar8;
      } while (pwVar13 < pwVar12);
    }
    cVar1 = '!';
    lVar4 = 1;
    do {
      iVar8 = p->nPos;
      p->nPos = iVar8 + 1;
      p->pOutput[iVar8] = cVar1;
      cVar1 = "!(!"[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (uVar5 == 1) {
      *pTruth = (s_Truths6Neg[v] & *pTruth) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                s_Truths6Neg[v] & *pTruth;
    }
    else {
      if (v < 6) {
        if ((int)uVar5 < 1) goto LAB_004a0508;
        uVar6 = s_Truths6Neg[v];
        uVar11 = 0;
        do {
          pTruth[uVar11] =
               (pTruth[uVar11] & uVar6) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
               pTruth[uVar11] & uVar6;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      else {
        if ((int)uVar5 < 1) goto LAB_004a0508;
        bVar2 = (byte)(v + -6);
        uVar7 = 1 << (bVar2 & 0x1f);
        iVar8 = 2 << (bVar2 & 0x1f);
        uVar6 = 1;
        if (1 < (int)uVar7) {
          uVar6 = (ulong)uVar7;
        }
        pwVar10 = pTruth + (int)uVar7;
        pwVar13 = pTruth;
        do {
          if (v + -6 != 0x1f) {
            uVar11 = 0;
            do {
              pwVar10[uVar11] = pwVar13[uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar6 != uVar11);
          }
          pwVar13 = pwVar13 + iVar8;
          pwVar10 = pwVar10 + iVar8;
        } while (pwVar13 < pwVar12);
      }
      if ((int)uVar5 < 1) goto LAB_004a0508;
    }
    uVar6 = 0;
    do {
      pTruth[uVar6] = ~pTruth[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
    goto LAB_004a0508;
  }
  if (v < 6) {
    if (0 < (int)uVar5) {
      uVar6 = 0;
      do {
        if ((pTruth[uVar6] & s_Truths6[v]) != 0) goto LAB_004a0145;
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
  }
  else if (0 < (int)uVar5) {
    bVar3 = (byte)(v + -6);
    uVar7 = 1 << (bVar3 & 0x1f);
    iVar8 = 2 << (bVar3 & 0x1f);
    uVar6 = 1;
    if (1 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    pwVar10 = pTruth + (int)uVar7;
    pwVar13 = pTruth;
    do {
      if (v + -6 != 0x1f) {
        uVar11 = 0;
        do {
          if (pwVar10[uVar11] != 0) goto LAB_004a0145;
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
      }
      pwVar13 = pwVar13 + iVar8;
      pwVar10 = pwVar10 + iVar8;
    } while (pwVar13 < pwVar12);
  }
  cVar1 = '(';
  lVar4 = 0;
  do {
    iVar8 = p->nPos;
    p->nPos = iVar8 + 1;
    p->pOutput[iVar8] = cVar1;
    cVar1 = "!(!"[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  if (uVar5 != 1) {
    if (v < 6) {
      if (0 < (int)uVar5) {
        uVar6 = s_Truths6Neg[v];
        uVar11 = 0;
        do {
          pTruth[uVar11] =
               (pTruth[uVar11] & uVar6) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
               pTruth[uVar11] & uVar6;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
    }
    else if (0 < (int)uVar5) {
      bVar2 = (byte)(v + -6);
      uVar5 = 1 << (bVar2 & 0x1f);
      iVar8 = 2 << (bVar2 & 0x1f);
      uVar9 = 1;
      if (1 < (int)uVar5) {
        uVar9 = (ulong)uVar5;
      }
      pwVar10 = pTruth + (int)uVar5;
      pwVar13 = pTruth;
      do {
        if (v + -6 != 0x1f) {
          uVar6 = 0;
          do {
            pwVar10[uVar6] = pwVar13[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar9 != uVar6);
        }
        pwVar13 = pwVar13 + iVar8;
        pwVar10 = pwVar10 + iVar8;
      } while (pwVar13 < pwVar12);
    }
    goto LAB_004a0508;
  }
  uVar9 = s_Truths6Neg[v] & *pTruth;
  uVar6 = uVar9 << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f);
LAB_0049ffc5:
  *pTruth = uVar6 | uVar9;
  goto LAB_004a0508;
LAB_004a0145:
  if (v < 6) {
    if ((int)uVar5 < 1) goto LAB_004a029b;
    uVar6 = 0;
    do {
      if ((s_Truths6[v] & ~(pTruth[uVar6] << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) ^ pTruth[uVar6]))
          != 0) {
        return 0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
LAB_004a0198:
    iVar8 = p->nPos;
    p->nPos = iVar8 + 1;
    p->pOutput[iVar8] = '[';
    if (uVar5 != 1) goto LAB_004a02ad;
    *pTruth = (s_Truths6Neg[v] & *pTruth) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
              s_Truths6Neg[v] & *pTruth;
  }
  else {
    if (0 < (int)uVar5) {
      bVar3 = (byte)(v + -6);
      uVar7 = 1 << (bVar3 & 0x1f);
      iVar8 = 2 << (bVar3 & 0x1f);
      uVar6 = 1;
      if (1 < (int)uVar7) {
        uVar6 = (ulong)uVar7;
      }
      pwVar10 = pTruth + (int)uVar7;
      pwVar13 = pTruth;
      do {
        if (v + -6 != 0x1f) {
          uVar11 = 0;
          do {
            if ((pwVar10[uVar11] ^ pwVar13[uVar11]) != 0xffffffffffffffff) {
              return 0;
            }
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        pwVar13 = pwVar13 + iVar8;
        pwVar10 = pwVar10 + iVar8;
      } while (pwVar13 < pwVar12);
      goto LAB_004a0198;
    }
LAB_004a029b:
    iVar8 = p->nPos;
    p->nPos = iVar8 + 1;
    p->pOutput[iVar8] = '[';
LAB_004a02ad:
    if (v < 6) {
      if (0 < (int)uVar5) {
        uVar6 = s_Truths6Neg[v];
        uVar11 = 0;
        do {
          pTruth[uVar11] =
               (pTruth[uVar11] & uVar6) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
               pTruth[uVar11] & uVar6;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
    }
    else if (0 < (int)uVar5) {
      bVar2 = (byte)(v + -6);
      uVar5 = 1 << (bVar2 & 0x1f);
      iVar8 = 2 << (bVar2 & 0x1f);
      uVar9 = 1;
      if (1 < (int)uVar5) {
        uVar9 = (ulong)uVar5;
      }
      pwVar10 = pTruth + (int)uVar5;
      pwVar13 = pTruth;
      do {
        if (v + -6 != 0x1f) {
          uVar6 = 0;
          do {
            pwVar10[uVar6] = pwVar13[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar9 != uVar6);
        }
        pwVar13 = pwVar13 + iVar8;
        pwVar10 = pwVar10 + iVar8;
      } while (pwVar13 < pwVar12);
    }
  }
  p->uConstMask = p->uConstMask | 1 << ((byte)p->nConsts & 0x1f);
LAB_004a0508:
  p->nConsts = p->nConsts + 1;
  Dau_DsdWriteVar(p,pVars[v],0);
  pVars[v] = pVars[(long)nVars + -1];
  Abc_TtSwapVars(pTruth,nVars,v,nVars + -1);
  return 1;
}

Assistant:

static inline int Dau_DsdDecomposeSingleVarOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v )
{
    int nWords = Abc_TtWordNum(nVars);
    // consider negative cofactors
    if ( pTruth[0] & 1 )
    {        
        if ( Abc_TtCof0IsConst1( pTruth, nWords, v ) ) // !(ax)
        {
            Dau_DsdWriteString( p, "!(" );
            Abc_TtCofactor1( pTruth, nWords, v );
            Abc_TtNot( pTruth, nWords );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_TtCof0IsConst0( pTruth, nWords, v ) ) // ax
        {
            Dau_DsdWriteString( p, "(" );
            Abc_TtCofactor1( pTruth, nWords, v );
            goto finish;            
        }
    }
    // consider positive cofactors
    if ( pTruth[nWords-1] >> 63 )
    {        
        if ( Abc_TtCof1IsConst1( pTruth, nWords, v ) ) // !(!ax)
        {
            Dau_DsdWriteString( p, "!(!" );
            Abc_TtCofactor0( pTruth, nWords, v );
            Abc_TtNot( pTruth, nWords );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_TtCof1IsConst0( pTruth, nWords, v ) ) // !ax
        {
            Dau_DsdWriteString( p, "(!" );
            Abc_TtCofactor0( pTruth, nWords, v );
            goto finish;            
        }
    }
    // consider equal cofactors
    if ( Abc_TtCofsOpposite( pTruth, nWords, v ) ) // [ax]
    {
        Dau_DsdWriteString( p, "[" );
        Abc_TtCofactor0( pTruth, nWords, v );
        p->uConstMask |= (1 << p->nConsts);
        goto finish;            
    }
    return 0;

finish:
    p->nConsts++;
    Dau_DsdWriteVar( p, pVars[v], 0 );
    pVars[v] = pVars[nVars-1];
    Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
    return 1;
}